

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsm-builder.cc
# Opt level: O0

Expression __thiscall
cnn::Cluster::neg_log_softmax(Cluster *this,Expression *h,uint r,ComputationGraph *cg)

{
  int in_ECX;
  Expression *in_RDX;
  long in_RSI;
  ComputationGraph *in_RDI;
  Cluster *in_R8;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double __x;
  Expression EVar2;
  Expression dist;
  Expression p;
  ComputationGraph *this_00;
  ComputationGraph *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  real in_stack_ffffffffffffff8c;
  ComputationGraph *in_stack_ffffffffffffffc8;
  Expression *in_stack_ffffffffffffffd0;
  undefined8 uVar1;
  
  if (*(int *)(in_RSI + 0xb4) == 1) {
    EVar2 = cnn::expr::input(in_stack_ffffffffffffff68,(real)((ulong)in_RSI >> 0x20));
    uVar1 = EVar2._8_8_;
  }
  else if (*(int *)(in_RSI + 0xb4) == 2) {
    this_00 = in_RDI;
    cnn::expr::Expression::Expression((Expression *)in_RDI,in_RDX);
    predict(in_R8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    cnn::expr::logistic((Expression *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88))
    ;
    __x = extraout_XMM0_Qa;
    if (in_ECX == 1) {
      cnn::expr::operator-
                (in_stack_ffffffffffffff8c,
                 (Expression *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      cnn::expr::Expression::operator=((Expression *)this_00,in_RDX);
      __x = extraout_XMM0_Qa_00;
    }
    cnn::expr::log((expr *)&stack0xffffffffffffff88,__x);
    EVar2 = cnn::expr::operator-
                      ((Expression *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    uVar1 = EVar2._8_8_;
  }
  else {
    cnn::expr::Expression::Expression((Expression *)in_RDI,in_RDX);
    predict(in_R8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    EVar2 = cnn::expr::pickneglogsoftmax
                      ((Expression *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                       in_stack_ffffffffffffff84);
    uVar1 = EVar2._8_8_;
  }
  EVar2._8_8_ = uVar1;
  EVar2.pg = in_RDI;
  return EVar2;
}

Assistant:

Expression Cluster::neg_log_softmax(Expression h, unsigned r, ComputationGraph& cg) const {
  if (output_size == 1) {
    return input(cg, 0.0f);
  }
  else if (output_size == 2) {
    Expression p = logistic(predict(h, cg));
    assert (r == 0 || r == 1);
    if (r == 1) {
      p = 1 - p;
    }
    return -log(p);
  }
  else {
    Expression dist = predict(h, cg);
    return pickneglogsoftmax(dist, r);
  }
}